

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operations.cpp
# Opt level: O3

bool duckdb::ValuePositionComparator::Final<duckdb::GreaterThanEquals>(Value *lhs,Value *rhs)

{
  byte bVar1;
  bool bVar2;
  
  if (((rhs->is_null | lhs->is_null) & 1U) == 0) {
    bVar2 = TemplatedBooleanOperation<duckdb::GreaterThan>(rhs,lhs);
    bVar1 = !bVar2;
  }
  else {
    bVar1 = rhs->is_null ^ 1U | lhs->is_null;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool ValuePositionComparator::Final<duckdb::GreaterThanEquals>(const Value &lhs, const Value &rhs) {
	return !ValuePositionComparator::Final<duckdb::GreaterThan>(rhs, lhs);
}